

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<1>::move_backward
          (InnerLeaf<1> *this,int *first,int *last)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  difference_type __d;
  long lVar6;
  
  iVar1 = *first;
  lVar5 = (long)iVar1;
  iVar3 = *last;
  lVar6 = (long)iVar3;
  if (lVar5 < lVar6) {
    uVar2 = (lVar6 - lVar5) + 1;
    pdVar4 = &(this->entries)._M_elems[lVar6].value_;
    do {
      ((HighsHashTableEntry<std::pair<int,_int>,_double> *)(pdVar4 + -1))->key_ =
           *(pair<int,_int> *)(pdVar4 + -3);
      *pdVar4 = pdVar4[-2];
      pdVar4 = pdVar4 + -2;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    iVar1 = *first;
    iVar3 = *last;
    lVar5 = (long)iVar1;
  }
  memmove((this->hashes)._M_elems + (long)iVar1 + 1,(this->hashes)._M_elems + lVar5,
          (long)(iVar3 - iVar1) << 3);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }